

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_Digest(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pData,CK_ULONG ulDataLen,
                 CK_BYTE_PTR pDigest,CK_ULONG_PTR pulDigestLen)

{
  int iVar1;
  Session *this_00;
  HashAlgorithm *pHVar2;
  size_t sVar3;
  uchar *__src;
  ulong __n;
  CK_RV CVar4;
  ByteString digest;
  ByteString data;
  ByteString local_80;
  ByteString local_58;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pData == (CK_BYTE_PTR)0x0 || pulDigestLen == (CK_ULONG_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar1 = Session::getOpType(this_00);
  if (iVar1 != 4) {
    return 0x91;
  }
  pHVar2 = Session::getDigestOp(this_00);
  iVar1 = (*pHVar2->_vptr_HashAlgorithm[5])(pHVar2);
  __n = (ulong)iVar1;
  if (pDigest == (CK_BYTE_PTR)0x0) {
    *pulDigestLen = __n;
    return 0;
  }
  if (*pulDigestLen < __n) {
    *pulDigestLen = __n;
    return 0x150;
  }
  ByteString::ByteString(&local_58,pData,ulDataLen);
  pHVar2 = Session::getDigestOp(this_00);
  iVar1 = (*pHVar2->_vptr_HashAlgorithm[3])(pHVar2,&local_58);
  if ((char)iVar1 == '\0') {
    CVar4 = 5;
    Session::resetOp(this_00);
    goto LAB_00133a80;
  }
  ByteString::ByteString(&local_80);
  pHVar2 = Session::getDigestOp(this_00);
  iVar1 = (*pHVar2->_vptr_HashAlgorithm[4])(pHVar2,&local_80);
  if ((char)iVar1 == '\0') {
LAB_00133a59:
    CVar4 = 5;
    Session::resetOp(this_00);
  }
  else {
    sVar3 = ByteString::size(&local_80);
    if (sVar3 != __n) {
      softHSMLog(3,"C_Digest",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xe9f,"The size of the digest differ from the size of the mechanism");
      goto LAB_00133a59;
    }
    __src = ByteString::byte_str(&local_80);
    memcpy(pDigest,__src,__n);
    *pulDigestLen = __n;
    Session::resetOp(this_00);
    CVar4 = 0;
  }
  local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_80.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
LAB_00133a80:
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return CVar4;
}

Assistant:

CK_RV SoftHSM::C_Digest(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pData, CK_ULONG ulDataLen, CK_BYTE_PTR pDigest, CK_ULONG_PTR pulDigestLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulDigestLen == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pData == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DIGEST) return CKR_OPERATION_NOT_INITIALIZED;

	// Return size
	CK_ULONG size = session->getDigestOp()->getHashSize();
	if (pDigest == NULL_PTR)
	{
		*pulDigestLen = size;
		return CKR_OK;
	}

	// Check buffer size
	if (*pulDigestLen < size)
	{
		*pulDigestLen = size;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the data
	ByteString data(pData, ulDataLen);

	// Digest the data
	if (session->getDigestOp()->hashUpdate(data) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Get the digest
	ByteString digest;
	if (session->getDigestOp()->hashFinal(digest) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Check size
	if (digest.size() != size)
	{
		ERROR_MSG("The size of the digest differ from the size of the mechanism");
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}
	memcpy(pDigest, digest.byte_str(), size);
	*pulDigestLen = size;

	session->resetOp();

	return CKR_OK;
}